

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadF64(BinaryReader *this,uint64_t *out_value,char *desc)

{
  Result RVar1;
  char *desc_local;
  uint64_t *out_value_local;
  BinaryReader *this_local;
  
  RVar1 = ReadT<unsigned_long>(this,out_value,"double",desc);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReader::ReadF64(uint64_t* out_value, const char* desc) {
  return ReadT(out_value, "double", desc);
}